

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinMantissa
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  const_reference pvVar1;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_RDX;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *in_RSI;
  long in_RDI;
  Value VVar2;
  double m;
  int exp;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *in_stack_00000220;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_stack_00000228;
  string *in_stack_00000230;
  LocationRange *in_stack_00000238;
  Interpreter *in_stack_00000240;
  undefined4 uStack_9c;
  allocator_type *in_stack_ffffffffffffff68;
  allocator<char> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 uVar3;
  allocator<char> local_39;
  string local_38 [8];
  double in_stack_ffffffffffffffd0;
  LocationRange *in_stack_ffffffffffffffd8;
  Interpreter *in_stack_ffffffffffffffe0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78
             ,in_stack_ffffffffffffff70);
  uVar3 = 2;
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x2302cc);
  __l._M_len._0_4_ = in_stack_ffffffffffffff80;
  __l._M_array = (iterator)in_stack_ffffffffffffff78;
  __l._M_len._4_4_ = uVar3;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)in_stack_ffffffffffffff70,__l,in_stack_ffffffffffffff68);
  validateBuiltinArgs(in_stack_00000240,in_stack_00000238,in_stack_00000230,in_stack_00000228,
                      in_stack_00000220);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~vector(in_RSI);
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::~allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x23031d);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  pvVar1 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[](in_RDX,0);
  frexp((pvVar1->v).d,(int *)&stack0xffffffffffffff7c);
  VVar2 = makeNumberCheck(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                          in_stack_ffffffffffffffd0);
  *(ulong *)(in_RDI + 0x40) = CONCAT44(uStack_9c,VVar2.t);
  *(anon_union_8_3_4e909c26_for_v *)(in_RDI + 0x48) = VVar2.v;
  return (AST *)0x0;
}

Assistant:

const AST *builtinMantissa(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "mantissa", args, {Value::NUMBER});
        int exp;
        double m = std::frexp(args[0].v.d, &exp);
        scratch = makeNumberCheck(loc, m);
        return nullptr;
    }